

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::Base64Test_encodeUrlTest_Test::TestBody
          (Base64Test_encodeUrlTest_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  allocator local_69;
  string local_68 [32];
  detail local_48 [8];
  string encoded;
  char acStack_28 [8];
  char unicodeText [19];
  Base64Test_encodeUrlTest_Test *this_local;
  
  builtin_strncpy(acStack_28,"Προμ",8);
  builtin_strncpy(unicodeText,"ηθεύς",0xb);
  unique0x10000234 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_68,acStack_28,&local_69);
  detail::base64url_encode(local_48,(string *)local_68);
  ::std::__cxx11::string::~string(local_68);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
  testing::internal::EqHelper::
  Compare<char[25],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_90,"\"zqDPgc6_zrzOt864zrXPjc-C\"","encoded",
             (char (*) [25])"zqDPgc6_zrzOt864zrXPjc-C",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/util/tests/unit/base64_test.cc"
               ,0x37,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  ::std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

TEST(Base64Test, encodeUrlTest) {
  const char unicodeText[] =
      "\xce\xa0\xcf\x81\xce\xbf\xce\xbc\xce\xb7\xce\xb8\xce\xb5\xcf\x8d\xcf"
      "\x82";  // Προμηθεύς
  std::string encoded = detail::base64url_encode(unicodeText);
  EXPECT_EQ("zqDPgc6_zrzOt864zrXPjc-C", encoded);
}